

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsontz.cpp
# Opt level: O3

void __thiscall icu_63::OlsonTimeZone::deleteTransitionRules(OlsonTimeZone *this)

{
  short sVar1;
  TimeArrayTimeZoneRule **buffer;
  long lVar2;
  
  if (this->initialRule != (InitialTimeZoneRule *)0x0) {
    (*(this->initialRule->super_TimeZoneRule).super_UObject._vptr_UObject[1])();
  }
  if (this->firstTZTransition != (TimeZoneTransition *)0x0) {
    (*(this->firstTZTransition->super_UObject)._vptr_UObject[1])();
  }
  if (this->firstFinalTZTransition != (TimeZoneTransition *)0x0) {
    (*(this->firstFinalTZTransition->super_UObject)._vptr_UObject[1])();
  }
  if (this->finalZoneWithStartYear != (SimpleTimeZone *)0x0) {
    (*(this->finalZoneWithStartYear->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject
      [1])();
  }
  buffer = this->historicRules;
  if (buffer != (TimeArrayTimeZoneRule **)0x0) {
    sVar1 = this->historicRuleCount;
    if (0 < sVar1) {
      lVar2 = 0;
      do {
        if (this->historicRules[lVar2] != (TimeArrayTimeZoneRule *)0x0) {
          (*(this->historicRules[lVar2]->super_TimeZoneRule).super_UObject._vptr_UObject[1])();
          sVar1 = this->historicRuleCount;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < sVar1);
      buffer = this->historicRules;
    }
    uprv_free_63(buffer);
  }
  this->finalZoneWithStartYear = (SimpleTimeZone *)0x0;
  this->firstTZTransitionIdx = 0;
  this->initialRule = (InitialTimeZoneRule *)0x0;
  this->firstTZTransition = (TimeZoneTransition *)0x0;
  this->historicRuleCount = 0;
  this->firstFinalTZTransition = (TimeZoneTransition *)0x0;
  this->historicRules = (TimeArrayTimeZoneRule **)0x0;
  LOCK();
  (this->transitionRulesInitOnce).fState.super___atomic_base<int>._M_i = 0;
  UNLOCK();
  return;
}

Assistant:

void
OlsonTimeZone::deleteTransitionRules(void) {
    if (initialRule != NULL) {
        delete initialRule;
    }
    if (firstTZTransition != NULL) {
        delete firstTZTransition;
    }
    if (firstFinalTZTransition != NULL) {
        delete firstFinalTZTransition;
    }
    if (finalZoneWithStartYear != NULL) {
        delete finalZoneWithStartYear;
    }
    if (historicRules != NULL) {
        for (int i = 0; i < historicRuleCount; i++) {
            if (historicRules[i] != NULL) {
                delete historicRules[i];
            }
        }
        uprv_free(historicRules);
    }
    clearTransitionRules();
}